

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O2

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  byte bVar1;
  uchar uVar2;
  undefined4 in_register_0000008c;
  void *__dest;
  int *piVar3;
  int iVar4;
  long lVar5;
  uchar *__src;
  uchar uVar6;
  
  __dest = (void *)CONCAT44(in_register_0000008c,n);
  piVar3 = stbiw__encode_png_line::mapping;
  if (height == 0) {
    piVar3 = stbiw__encode_png_line::firstmap;
  }
  __src = pixels + height * stride_bytes;
  if (piVar3[y] == 0) {
    memcpy(__dest,__src,(long)(width << 2));
    return;
  }
  lVar5 = 0;
  iVar4 = piVar3[y] + -1;
  do {
    if (lVar5 == 4) {
      switch(iVar4) {
      case 0:
        for (lVar5 = 4; lVar5 < width << 2; lVar5 = lVar5 + 1) {
          *(uchar *)((long)__dest + lVar5) = __src[lVar5] - __src[lVar5 + -4];
        }
        break;
      case 1:
        for (lVar5 = 4; lVar5 < width << 2; lVar5 = lVar5 + 1) {
          *(uchar *)((long)__dest + lVar5) = __src[lVar5] - __src[lVar5 - stride_bytes];
        }
        break;
      case 2:
        for (lVar5 = 4; lVar5 < width << 2; lVar5 = lVar5 + 1) {
          *(uchar *)((long)__dest + lVar5) =
               __src[lVar5] -
               (char)((uint)__src[lVar5 - stride_bytes] + (uint)__src[lVar5 + -4] >> 1);
        }
        break;
      case 3:
        for (lVar5 = 4; lVar5 < width << 2; lVar5 = lVar5 + 1) {
          uVar6 = __src[lVar5];
          uVar2 = stbiw__paeth((uint)__src[lVar5 + -4],(uint)__src[lVar5 - stride_bytes],
                               (uint)__src[lVar5 + (-4 - (long)stride_bytes)]);
          *(uchar *)((long)__dest + lVar5) = uVar6 - uVar2;
        }
        break;
      case 4:
        for (lVar5 = 4; lVar5 < width << 2; lVar5 = lVar5 + 1) {
          *(uchar *)((long)__dest + lVar5) = __src[lVar5] - (__src[lVar5 + -4] >> 1);
        }
        break;
      case 5:
        for (lVar5 = 4; lVar5 < width << 2; lVar5 = lVar5 + 1) {
          *(uchar *)((long)__dest + lVar5) = __src[lVar5] - __src[lVar5 + -4];
        }
      }
      return;
    }
    switch(iVar4) {
    case 0:
    case 4:
    case 5:
      uVar6 = __src[lVar5];
      break;
    case 1:
      uVar6 = __src[lVar5] - __src[lVar5 - stride_bytes];
      break;
    case 2:
      uVar6 = __src[lVar5];
      bVar1 = __src[lVar5 - stride_bytes] >> 1;
      goto LAB_00132229;
    case 3:
      uVar6 = __src[lVar5];
      bVar1 = stbiw__paeth(0,(uint)__src[lVar5 - stride_bytes],0);
LAB_00132229:
      uVar6 = uVar6 - bVar1;
      break;
    default:
      goto switchD_001321f4_default;
    }
    *(uchar *)((long)__dest + lVar5) = uVar6;
switchD_001321f4_default:
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes, int width, int height, int y, int n, int filter_type, signed char *line_buffer)
{
   static int mapping[] = { 0,1,2,3,4 };
   static int firstmap[] = { 0,1,0,5,6 };
   int *mymap = (y != 0) ? mapping : firstmap;
   int i;
   int type = mymap[filter_type];
   unsigned char *z = pixels + stride_bytes * (stbi__flip_vertically_on_write ? height-1-y : y);
   int signed_stride = stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;

   if (type==0) {
      memcpy(line_buffer, z, width*n);
      return;
   }

   // first loop isn't optimized since it's just one pixel
   for (i = 0; i < n; ++i) {
      switch (type) {
         case 1: line_buffer[i] = z[i]; break;
         case 2: line_buffer[i] = z[i] - z[i-signed_stride]; break;
         case 3: line_buffer[i] = z[i] - (z[i-signed_stride]>>1); break;
         case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-signed_stride],0)); break;
         case 5: line_buffer[i] = z[i]; break;
         case 6: line_buffer[i] = z[i]; break;
      }
   }
   switch (type) {
      case 1: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-n]; break;
      case 2: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-signed_stride]; break;
      case 3: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - ((z[i-n] + z[i-signed_stride])>>1); break;
      case 4: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-signed_stride], z[i-signed_stride-n]); break;
      case 5: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - (z[i-n]>>1); break;
      case 6: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
   }
}